

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_DamageSelf
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int selector;
  PClass *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  AActor *source;
  AActor *inflictor;
  AActor *origin;
  int selector_00;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  int local_44;
  PClassActor *local_40;
  FName local_38;
  FName local_34;
  PClass *pPVar4;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003defcb;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003def9c:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003defcb:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16c6,
                  "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003dedd9;
    pPVar4 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar2 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
      (origin->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar7 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar1 && bVar7) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar1) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003defcb;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003def9c;
LAB_003dedd9:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_003deff3:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16c7,
                  "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_003deff3;
  }
  iVar2 = param[1].field_0.i;
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003df081;
    }
    iVar6 = param[2].field_0.i;
LAB_003dee2c:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003df0a0:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16c9,
                    "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_44 = param[3].field_0.i;
LAB_003dee3b:
    if (param[4].field_0.field_3.Type != '\x03') {
LAB_003defa5:
      pcVar5 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003defac:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16ca,
                    "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_40 = (PClassActor *)param[4].field_0.field_1.a;
    if (param[4].field_0.field_1.atag != 1) {
      if (local_40 != (PClassActor *)0x0) goto LAB_003defa5;
      local_40 = (PClassActor *)0x0;
    }
LAB_003dee5d:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003df050:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16cb,
                    "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar3 = param[5].field_0.i;
LAB_003dee6c:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003df031:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16cc,
                    "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    selector_00 = param[6].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
LAB_003df081:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x16c8,
                    "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003dee2c;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003df0a0;
    }
    local_44 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003dee3b;
    }
    if ((param[4].field_0.field_3.Type != '\x03') ||
       (local_40 = (PClassActor *)param[4].field_0.field_1.a,
       local_40 != (PClassActor *)0x0 && param[4].field_0.field_1.atag != 1)) {
      pcVar5 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003defac;
    }
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003dee5d;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003df050;
    }
    iVar3 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003dee6c;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003df031;
    }
    selector_00 = param[6].field_0.i;
    if (numparam != 7) {
      if (param[7].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003df012;
      }
      goto LAB_003dee93;
    }
    param = defaultparam->Array;
  }
  if (param[7].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003df012:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x16cd,
                  "int AF_AActor_A_DamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003dee93:
  selector = param[7].field_0.i;
  source = COPY_AAPTR(origin,selector_00);
  inflictor = COPY_AAPTR(origin,selector);
  local_38.Index = iVar3;
  local_34.Index = iVar6;
  DoDamage(origin,inflictor,source,iVar2,&local_34,local_44,local_40,&local_38);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DamageSelf)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(amount);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	DoDamage(self, inflictor, source, amount, damagetype, flags, filter, species);
	return 0;
}